

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishDataBuffer
               (HelicsPublication pub,HelicsDataBuffer buffer,HelicsError *err)

{
  PublicationObject *pPVar1;
  SmallBuffer *pSVar2;
  defV pubVal;
  defV *in_stack_00000070;
  DataType in_stack_0000007c;
  SmallBuffer *buff;
  PublicationObject *pubObj;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff58;
  HelicsError *in_stack_ffffffffffffff60;
  Publication *this;
  char (*in_stack_ffffffffffffff68) [1];
  SmallBuffer *in_stack_ffffffffffffff78;
  data_view *in_stack_ffffffffffffff80;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (pPVar1 != (PublicationObject *)0x0) {
    pSVar2 = getBuffer(in_stack_ffffffffffffff68);
    if (pSVar2 == (SmallBuffer *)0x0) {
      helics::Publication::publish<char[1]>((Publication *)0x0,in_stack_ffffffffffffff68);
    }
    else {
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)0x1cecb9);
      this = (Publication *)&stack0xffffffffffffff78;
      helics::data_view::data_view(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      helics::valueExtract((data_view *)buff,in_stack_0000007c,in_stack_00000070);
      helics::data_view::~data_view((data_view *)0x1cecf0);
      helics::Publication::
      publish<std::variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>>
                (this,in_stack_ffffffffffffff58);
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x1ced12);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishDataBuffer(HelicsPublication pub, HelicsDataBuffer buffer, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        auto* buff = getBuffer(buffer);
        if (buff == nullptr) {
            pubObj->pubPtr->publish("");
            return;
        }
        helics::defV pubVal;
        helics::valueExtract(helics::data_view(*buff), helics::DataType::HELICS_UNKNOWN, pubVal);
        pubObj->pubPtr->publish(pubVal);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}